

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_> *node
          )

{
  long lVar1;
  long *plVar2;
  runtime_error *this_00;
  long *in_RDX;
  Transformer local_38;
  long *local_30;
  long *local_28;
  
  lVar1 = *in_RDX;
  if (lVar1 != 0) {
    plVar2 = (long *)__dynamic_cast(lVar1,&AbstractPort::typeinfo,&Port::typeinfo,0);
    if (plVar2 == (long *)0x0) {
      local_30 = (long *)__dynamic_cast(lVar1,&AbstractPort::typeinfo,&StringPort::typeinfo,0);
      if (local_30 == (long *)0x0) goto LAB_00168c68;
      *in_RDX = 0;
      (*(code *)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::AbstractPort_*,_std::default_delete<verilogAST::AbstractPort>_>
                .super__Head_base<0UL,_verilogAST::AbstractPort_*,_false>._M_head_impl[0x13].
                super_Node._vptr_Node)(&local_38,node);
      this->_vptr_Transformer = (_func_int **)local_38;
      plVar2 = local_30;
    }
    else {
      *in_RDX = 0;
      local_28 = plVar2;
      (*(code *)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::AbstractPort_*,_std::default_delete<verilogAST::AbstractPort>_>
                .super__Head_base<0UL,_verilogAST::AbstractPort_*,_false>._M_head_impl[0x12].
                super_Node._vptr_Node)(&local_38,node);
      this->_vptr_Transformer = (_func_int **)local_38;
      plVar2 = local_28;
    }
    local_38._vptr_Transformer = (_func_int **)0x0;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))();
    }
    return (__uniq_ptr_data<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>,_true,_true>
            )(__uniq_ptr_data<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>,_true,_true>
              )this;
  }
LAB_00168c68:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unreachable");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Vector> Transformer::visit(std::unique_ptr<Vector> node) {
  node->id = this->visit(std::move(node->id));
  node->msb = this->visit(std::move(node->msb));
  node->lsb = this->visit(std::move(node->lsb));
  if (auto ptr = dynamic_cast<NDVector*>(node.get())) {
    std::vector<
        std::pair<std::unique_ptr<Expression>, std::unique_ptr<Expression>>>
        new_outer_dims;
    for (auto& dim : ptr->outer_dims) {
      new_outer_dims.push_back({this->visit(std::move(dim.first)),
                                this->visit(std::move(dim.second))});
    }
    ptr->outer_dims = std::move(new_outer_dims);
  }
  return node;
}